

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HostCoordinator.hpp
# Opt level: O3

void __thiscall
memory::HostCoordinator<int,memory::Allocator<int,memory::impl::AlignedPolicy<8ul>>>::
copy<memory::Allocator<int,memory::impl::AlignedPolicy<8ul>>,memory::Allocator<int,memory::impl::AlignedPolicy<8ul>>>
          (HostCoordinator<int,memory::Allocator<int,memory::impl::AlignedPolicy<8ul>>> *this,
          ConstArrayView<value_type,_HostCoordinator<value_type,_Allocator<int,_AlignedPolicy<8UL>_>_>_>
          *from,ArrayView<value_type,_HostCoordinator<value_type,_Allocator<int,_AlignedPolicy<8UL>_>_>_>
                *to)

{
  size_type sVar1;
  pointer __src;
  pointer __dest;
  
  sVar1 = from->size_;
  if (sVar1 != to->size_) {
    __assert_fail("from.size()==to.size()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/bcumming[P]vector/include/HostCoordinator.hpp"
                  ,0x7b,
                  "void memory::HostCoordinator<int>::copy(const ConstArrayView<value_type, HostCoordinator<value_type, Allocator1>> &, ArrayView<value_type, HostCoordinator<value_type, Allocator2>> &) [T = int, Allocator = memory::Allocator<int, memory::impl::AlignedPolicy<8>>, Allocator1 = memory::Allocator<int, memory::impl::AlignedPolicy<8>>, Allocator2 = memory::Allocator<int, memory::impl::AlignedPolicy<8>>]"
                 );
  }
  __src = from->pointer_;
  __dest = to->pointer_;
  if (__src + sVar1 <= __dest || __dest + sVar1 <= __src) {
    if (sVar1 != 0) {
      memmove(__dest,__src,sVar1 << 2);
      return;
    }
    return;
  }
  __assert_fail("!from.overlaps(to)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/bcumming[P]vector/include/HostCoordinator.hpp"
                ,0x7c,
                "void memory::HostCoordinator<int>::copy(const ConstArrayView<value_type, HostCoordinator<value_type, Allocator1>> &, ArrayView<value_type, HostCoordinator<value_type, Allocator2>> &) [T = int, Allocator = memory::Allocator<int, memory::impl::AlignedPolicy<8>>, Allocator1 = memory::Allocator<int, memory::impl::AlignedPolicy<8>>, Allocator2 = memory::Allocator<int, memory::impl::AlignedPolicy<8>>]"
               );
}

Assistant:

void copy(const ConstArrayView<value_type, HostCoordinator<value_type, Allocator1>>& from,
                    ArrayView<value_type, HostCoordinator<value_type, Allocator2>>& to)
    {
        assert(from.size()==to.size());
        assert(!from.overlaps(to));

        #ifdef VERBOSE
        using c1 = HostCoordinator<value_type, Allocator1>;
        std::cerr << util::type_printer<c1>::print()
                  << "::" + util::blue("copy") << "(" << from.size()
                  << " [" << from.size()*sizeof(value_type) << " bytes])"
                  << " " << from.data() << util::yellow(" -> ") << to.data()
                  << std::endl;
        #endif

        std::copy(from.begin(), from.end(), to.begin());
    }